

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsum.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  ifstream *input_stream;
  int vector_length;
  allocator local_4a9;
  int num_data;
  int output_interval;
  string local_4a0;
  ulong local_480;
  vector<double,_std::allocator<double>_> sum;
  vector<double,_std::allocator<double>_> data;
  StatisticsAccumulation accumulation;
  ostringstream error_message_5;
  Buffer buffer;
  ifstream ifs;
  byte abStack_218 [488];
  
  vector_length = 1;
  output_interval = -1;
  local_480 = 0;
LAB_001025c6:
  do {
    while( true ) {
      iVar4 = ya_getopt_long(argc,argv,"l:m:t:ch",(option *)0x0,(int *)0x0);
      if (iVar4 != 0x6c) break;
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
      bVar2 = vector_length < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_5,"vsum",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_001029b9:
        std::__cxx11::string::~string((string *)&error_message_5);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
    if (iVar4 != 0x6d) {
      if (iVar4 == 0x74) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
        bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&output_interval);
        bVar2 = output_interval < 1;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,
                          "The argument for the -t option must be a positive integer");
          std::__cxx11::string::string((string *)&error_message_5,"vsum",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
          goto LAB_001029b9;
        }
      }
      else {
        if (iVar4 == -1) {
          if (1 < argc - ya_optind) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Too many input files");
            std::__cxx11::string::string((string *)&error_message_5,"vsum",(allocator *)&buffer);
            sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
            goto LAB_001029b9;
          }
          if (argc == ya_optind) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = argv[ya_optind];
          }
          bVar2 = sptk::SetBinaryMode();
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Cannot set translation mode");
            std::__cxx11::string::string((string *)&error_message_5,"vsum",(allocator *)&buffer);
            sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
            goto LAB_001029b9;
          }
          input_stream = &ifs;
          std::ifstream::ifstream(input_stream);
          if ((pcVar6 != (char *)0x0) &&
             (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
             (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
            poVar5 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
            std::operator<<(poVar5,pcVar6);
            std::__cxx11::string::string((string *)&buffer,"vsum",(allocator *)&local_4a0);
            sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
            std::__cxx11::string::~string((string *)&buffer);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
            iVar4 = 1;
            goto LAB_00102e01;
          }
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (ifstream *)&std::cin;
          }
          iVar4 = 1;
          sptk::StatisticsAccumulation::StatisticsAccumulation
                    (&accumulation,vector_length + -1,1,false,false);
          sptk::StatisticsAccumulation::Buffer::Buffer(&buffer);
          if (accumulation.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
            std::operator<<((ostream *)&error_message_5,
                            "Failed to initialize StatisticsAccumulation");
            std::__cxx11::string::string((string *)&local_4a0,"vsum",(allocator *)&data);
            sptk::PrintErrorMessage(&local_4a0,&error_message_5);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
            goto LAB_00102df4;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    (&data,(long)vector_length,(allocator_type *)&error_message_5);
          std::vector<double,_std::allocator<double>_>::vector
                    (&sum,(long)vector_length,(allocator_type *)&error_message_5);
          iVar4 = 1;
          break;
        }
        if (iVar4 != 99) {
          if (iVar4 == 0x68) {
            anon_unknown.dwarf_2bdd::PrintUsage((ostream *)&std::cout);
            return 0;
          }
          anon_unknown.dwarf_2bdd::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        local_480 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
      }
      goto LAB_001025c6;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&vector_length);
    bVar1 = vector_length < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2 || bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_5,"vsum",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      goto LAB_001029b9;
    }
    vector_length = vector_length + 1;
  } while( true );
LAB_00102a7f:
  bVar2 = sptk::ReadStream<double>(false,0,0,vector_length,&data,(istream *)input_stream,(int *)0x0)
  ;
  if (!bVar2) goto LAB_00102b7d;
  bVar2 = sptk::StatisticsAccumulation::Run(&accumulation,&data,&buffer);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to accumulate statistics");
    std::__cxx11::string::string((string *)&local_4a0,"vsum",(allocator *)&num_data);
    sptk::PrintErrorMessage(&local_4a0,&error_message_5);
    goto LAB_00102dc5;
  }
  if ((output_interval != -1) && (iVar4 % output_interval == 0)) {
    bVar2 = sptk::StatisticsAccumulation::GetSum(&accumulation,&buffer,&sum);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to accumulate statistics");
      std::__cxx11::string::string((string *)&local_4a0,"vsum",(allocator *)&num_data);
      sptk::PrintErrorMessage(&local_4a0,&error_message_5);
      goto LAB_00102dc5;
    }
    bVar2 = sptk::WriteStream<double>(0,vector_length,&sum,(ostream *)&std::cout,(int *)0x0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to write statistics");
      std::__cxx11::string::string((string *)&local_4a0,"vsum",(allocator *)&num_data);
      sptk::PrintErrorMessage(&local_4a0,&error_message_5);
      goto LAB_00102dc5;
    }
    if ((local_480 & 1) == 0) {
      sptk::StatisticsAccumulation::Clear(&accumulation,&buffer);
    }
  }
  iVar4 = iVar4 + 1;
  goto LAB_00102a7f;
LAB_00102b7d:
  bVar2 = sptk::StatisticsAccumulation::GetNumData(&accumulation,&buffer,&num_data);
  if (bVar2) {
    iVar4 = 0;
    if ((output_interval != -1) || (num_data < 1)) goto LAB_00102de0;
    bVar2 = sptk::StatisticsAccumulation::GetSum(&accumulation,&buffer,&sum);
    if (bVar2) {
      iVar4 = 0;
      bVar2 = sptk::WriteStream<double>(0,vector_length,&sum,(ostream *)&std::cout,(int *)0x0);
      if (bVar2) goto LAB_00102de0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to write summation");
      std::__cxx11::string::string((string *)&local_4a0,"vsum",&local_4a9);
      sptk::PrintErrorMessage(&local_4a0,&error_message_5);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::operator<<((ostream *)&error_message_5,"Failed to compute summation");
      std::__cxx11::string::string((string *)&local_4a0,"vsum",&local_4a9);
      sptk::PrintErrorMessage(&local_4a0,&error_message_5);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
    std::operator<<((ostream *)&error_message_5,"Failed to accumulate statistics");
    std::__cxx11::string::string((string *)&local_4a0,"vsum",&local_4a9);
    sptk::PrintErrorMessage(&local_4a0,&error_message_5);
  }
LAB_00102dc5:
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
  iVar4 = 1;
LAB_00102de0:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&sum.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102df4:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer);
LAB_00102e01:
  std::ifstream::~ifstream(&ifs);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  bool cumulative_mode_flag(kDefaultCumulativeModeFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:t:ch", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        cumulative_mode_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation accumulation(vector_length - 1, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::vector<double> data(vector_length);
  std::vector<double> sum(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!accumulation.GetSum(buffer, &sum)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!cumulative_mode_flag) {
        accumulation.Clear(&buffer);
      }
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!accumulation.GetSum(buffer, &sum)) {
      std::ostringstream error_message;
      error_message << "Failed to compute summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }

  return 0;
}